

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ISceneNode.h
# Opt level: O3

void __thiscall irr::scene::ISceneNode::removeAll(ISceneNode *this)

{
  int *piVar1;
  _List_node_base *p_Var2;
  long lVar3;
  _List_node_base *p_Var4;
  
  for (p_Var4 = (this->Children).
                super__List_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var4 != (_List_node_base *)&this->Children; p_Var4 = p_Var4->_M_next) {
    p_Var4[1]._M_next[0xc]._M_next = (_List_node_base *)0x0;
    p_Var2 = p_Var4[1]._M_next;
    if (*(char *)((long)(p_Var2 + 0xb) + 8) == '\x01') {
      *(undefined1 *)((long)(p_Var2 + 0xb) + 8) = 0;
    }
    lVar3 = *(long *)((long)p_Var2->_M_next + -0x18);
    piVar1 = (int *)((long)(p_Var2 + 1) + lVar3);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (**(code **)(*(long *)((long)&p_Var2->_M_next + lVar3) + 8))();
    }
  }
  ::std::__cxx11::list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_>::clear
            (&this->Children);
  return;
}

Assistant:

virtual void removeAll()
	{
		for (auto &child : Children) {
			child->Parent = nullptr;
			child->ThisIterator = std::nullopt;
			child->drop();
		}
		Children.clear();
	}